

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImGuiDataType data_type_00;
  ImGuiDataType data_type_01;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float logarithmic_zero_epsilon;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_98;
  
  pIVar2 = GImGui;
  uVar6 = flags & 0x100000;
  fVar15 = *(float *)((long)&(bb->Min).x + (ulong)(uVar6 >> 0x12));
  fVar1 = *(float *)((long)&(bb->Max).x + (ulong)(uVar6 >> 0x12));
  fVar14 = (fVar1 - fVar15) + -4.0;
  uVar5 = data_type & 0xfffffffe;
  fVar16 = (GImGui->Style).GrabMinSize;
  fVar9 = (float)(~-(uint)(v_min < v_max) & (uint)(v_min - v_max) |
                 (uint)(v_max - v_min) & -(uint)(v_min < v_max));
  if ((uVar5 != 8) && (0.0 <= fVar9)) {
    fVar11 = fVar14 / (fVar9 + 1.0);
    uVar7 = -(uint)(fVar16 <= fVar11);
    fVar16 = (float)(~uVar7 & (uint)fVar16 | (uint)fVar11 & uVar7);
  }
  if (fVar14 <= fVar16) {
    fVar16 = fVar14;
  }
  fVar12 = fVar14 - fVar16;
  fVar11 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar5 == 8) {
      iVar3 = ImParseFormatPrecision(format,3);
      fVar11 = (float)iVar3;
    }
    else {
      fVar11 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar11);
    fVar11 = fVar12;
    if (fVar12 <= 1.0) {
      fVar11 = 1.0;
    }
    fVar11 = ((pIVar2->Style).LogSliderDeadzone * 0.5) / fVar11;
  }
  fVar15 = fVar15 + 2.0 + fVar16 * 0.5;
  if (pIVar2->ActiveId != id) {
    bVar4 = false;
    goto LAB_001b745f;
  }
  if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar2->ActiveIdIsJustActivated == true) {
      pIVar2->SliderCurrentAccum = 0.0;
      pIVar2->SliderCurrentAccumDirty = false;
    }
    IVar10 = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar12 = IVar10.x;
    if (uVar6 != 0) {
      fVar12 = -IVar10.y;
    }
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      if ((uVar5 == 8) && (iVar3 = ImParseFormatPrecision(format,3), 0 < iVar3)) {
        fVar12 = fVar12 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar12 = fVar12 / 10.0;
        }
      }
      else if ((ABS(fVar9) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
        fVar12 = *(float *)(&DAT_001e3138 + (ulong)(fVar12 < 0.0) * 4) / fVar9;
      }
      else {
        fVar12 = fVar12 / 100.0;
      }
      uVar5 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      pIVar2->SliderCurrentAccum =
           (float)(~uVar5 & (uint)fVar12 | (uint)(fVar12 * 10.0) & uVar5) +
           pIVar2->SliderCurrentAccum;
      pIVar2->SliderCurrentAccumDirty = true;
    }
    fVar9 = pIVar2->SliderCurrentAccum;
    if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if (pIVar2->SliderCurrentAccumDirty == true) {
      bVar4 = SUB41((flags & 0x20U) >> 5,0);
      fVar12 = ScaleRatioFromValueT<float,float,float>
                         (data_type,*v,v_min,v_max,bVar4,logarithmic_zero_epsilon,fVar11);
      if (((1.0 <= fVar12) && (0.0 < fVar9)) || ((fVar12 <= 0.0 && (fVar9 < 0.0)))) {
        fVar13 = 0.0;
        bVar4 = false;
        fVar8 = fVar12;
      }
      else {
        fVar13 = fVar9 + fVar12;
        fVar8 = 1.0;
        if (fVar13 <= 1.0) {
          fVar8 = fVar13;
        }
        fVar8 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar8);
        fVar13 = ScaleValueFromRatioT<float,float,float>
                           (data_type,fVar8,v_min,v_max,bVar4,logarithmic_zero_epsilon,fVar11);
        if ((flags & 0x40U) == 0) {
          fVar13 = RoundScalarWithFormatT<float,float>
                             ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,fVar13);
        }
        fVar13 = ScaleRatioFromValueT<float,float,float>
                           (data_type,fVar13,v_min,v_max,bVar4,logarithmic_zero_epsilon,fVar11);
        fVar13 = fVar13 - fVar12;
        if (fVar9 <= 0.0) {
          fVar13 = (float)(~-(uint)(fVar9 <= fVar13) & (uint)fVar9 |
                          (uint)fVar13 & -(uint)(fVar9 <= fVar13));
        }
        else if (fVar9 <= fVar13) {
          fVar13 = fVar9;
        }
        fVar13 = pIVar2->SliderCurrentAccum - fVar13;
        bVar4 = true;
      }
      pIVar2->SliderCurrentAccum = fVar13;
      pIVar2->SliderCurrentAccumDirty = false;
      goto LAB_001b73dc;
    }
    fVar8 = 0.0;
    bVar4 = false;
  }
  else {
    fVar8 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar2->IO).MouseDown[0] != false) {
        if (0.0 < fVar12) {
          fVar12 = (*(float *)((pIVar2->IO).MouseDown + (ulong)(uVar6 >> 0x14) * 4 + -8) - fVar15) /
                   fVar12;
          fVar8 = 1.0;
          if (fVar12 <= 1.0) {
            fVar8 = fVar12;
          }
          fVar8 = (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar8);
        }
        if (uVar6 != 0) {
          fVar8 = 1.0 - fVar8;
        }
        bVar4 = true;
        goto LAB_001b73dc;
      }
      ClearActiveID();
    }
    fVar8 = 0.0;
    bVar4 = false;
  }
LAB_001b73dc:
  if (bVar4) {
    fVar9 = ScaleValueFromRatioT<float,float,float>
                      (data_type,fVar8,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                       logarithmic_zero_epsilon,fVar11);
    if ((flags & 0x40U) == 0) {
      fVar9 = RoundScalarWithFormatT<float,float>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_01,fVar9);
    }
    fVar12 = *v;
    if ((fVar12 != fVar9) || (NAN(fVar12) || NAN(fVar9))) {
      *v = fVar9;
      bVar4 = true;
    }
    else {
      bVar4 = (bool)(-(fVar9 != fVar12) & 1);
    }
  }
  else {
    bVar4 = false;
  }
LAB_001b745f:
  if (1.0 <= fVar14) {
    local_98 = -fVar16;
    fVar9 = ScaleRatioFromValueT<float,float,float>
                      (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                       logarithmic_zero_epsilon,fVar11);
    if (uVar6 != 0) {
      fVar9 = 1.0 - fVar9;
    }
    fVar15 = (((fVar1 + -2.0) - fVar16 * 0.5) - fVar15) * fVar9 + fVar15;
    if (uVar6 != 0) {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = local_98 * 0.5 + fVar15;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar16 * 0.5 + fVar15;
    }
    else {
      fVar1 = (bb->Min).y;
      fVar9 = (bb->Max).y;
      (out_grab_bb->Min).x = local_98 * 0.5 + fVar15;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar16 * 0.5 + fVar15;
      (out_grab_bb->Max).y = fVar9 + -2.0;
    }
  }
  else {
    IVar10 = bb->Min;
    out_grab_bb->Min = IVar10;
    out_grab_bb->Max = IVar10;
  }
  return bVar4;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}